

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O0

int jbcoin::RFC1751::wsrch(string *strWord,int iMin,int iMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iDir;
  int iMid;
  int iResult;
  int iMax_local;
  int iMin_local;
  string *strWord_local;
  
  iDir = -1;
  iVar1 = iDir;
  iVar2 = iMax;
  iResult = iMin;
  while (iMid = iVar2, iDir = iVar1, iDir < 0 && iResult != iMid) {
    iVar3 = iResult + (iMid - iResult) / 2;
    iVar4 = std::__cxx11::string::compare((char *)strWord);
    iVar1 = iVar3;
    iVar2 = iMid;
    if ((iVar4 != 0) && (iVar1 = iDir, iVar2 = iVar3, -1 < iVar4)) {
      iResult = iVar3 + 1;
      iVar2 = iMid;
    }
  }
  return iDir;
}

Assistant:

int RFC1751::wsrch (std::string const& strWord, int iMin, int iMax)
{
    int iResult = -1;

    while (iResult < 0 && iMin != iMax)
    {
        // Have a range to search.
        int iMid    = iMin + (iMax - iMin) / 2;
        int iDir    = strWord.compare (s_dictionary[iMid]);

        if (!iDir)
        {
            iResult = iMid;     // Found it.
        }
        else if (iDir < 0)
        {
            iMax    = iMid;     // key < middle, middle is new max.
        }
        else
        {
            iMin    = iMid + 1; // key > middle, new min is past the middle.
        }
    }

    return iResult;
}